

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

positionTy *
LTAptFindRwy(positionTy *__return_storage_ptr__,FlightModel *_mdl,positionTy *_from,
            double _speed_m_s,string *_rwyId,string *_logTxt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  RwyEndPt *re;
  _Base_ptr p_Var9;
  double dVar10;
  double dVar11;
  ulong extraout_XMM0_Qb;
  double dVar12;
  double dVar13;
  double local_b8;
  double local_88;
  _Rb_tree_node_base *local_80;
  string local_78;
  FlightModel *local_58;
  positionTy *local_50;
  double local_48;
  ulong uStack_40;
  
  dVar2 = _mdl->VSI_FINAL;
  dVar3 = _mdl->VSI_MAX;
  dVar10 = _mdl->FLAPS_DOWN_SPEED;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&mtxGMapApt);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  if ((_Rb_tree_header *)gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    dVar10 = (dVar10 * 0.8) / 1.94384;
    if (_speed_m_s <= dVar10) {
      dVar10 = _speed_m_s;
    }
    local_88 = NAN;
    local_80 = (_Rb_tree_node_base *)0x0;
    p_Var8 = (_Base_ptr)0x0;
    local_b8 = 15.0;
    p_Var7 = gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = _mdl;
    local_50 = __return_storage_ptr__;
    do {
      p_Var9 = p_Var7[8]._M_left;
      p_Var4 = p_Var7[8]._M_right;
      if (p_Var9 != p_Var4) {
        do {
          dVar11 = HeadingDiff((double)p_Var9[3]._M_parent,_from->_head);
          if ((ABS(dVar11) <= 15.0) && (!NAN(*(double *)(p_Var9 + 3)))) {
            dVar11 = CoordAngle(_from->_lat,_from->_lon,*(double *)p_Var9,(double)p_Var9->_M_parent)
            ;
            dVar11 = HeadingDiff(_from->_head,dVar11);
            if ((ABS(dVar11) <= local_b8) &&
               (local_48 = ABS(dVar11), uStack_40 = extraout_XMM0_Qb & 0x7fffffffffffffff,
               dVar11 = CoordDistance(_from->_lat,_from->_lon,*(double *)p_Var9,
                                      (double)p_Var9->_M_parent), dVar11 <= 37040.0)) {
              dVar13 = _from->_alt - *(double *)(p_Var9 + 3);
              dVar12 = -dVar13 / (dVar11 / dVar10);
              if (dVar3 * -0.00508 <= dVar12) {
                if (dVar13 <= 100.0) {
                  if (dVar11 <= 3000.0) goto LAB_0015be3b;
                }
                else if (dVar12 <= dVar2 * 0.5 * 0.00508) {
LAB_0015be3b:
                  local_88 = dVar11 / dVar10 + _from->_ts;
                  local_b8 = local_48;
                  p_Var8 = p_Var9;
                  local_80 = p_Var7 + 2;
                }
              }
            }
          }
          p_Var9 = (_Base_ptr)&p_Var9[3]._M_left;
        } while (p_Var9 != p_Var4);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      __return_storage_ptr__ = local_50;
    } while ((_Rb_tree_header *)p_Var7 != &gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    if ((p_Var8 != (_Base_ptr)0x0) && (local_80 != (_Rb_tree_node_base *)0x0)) {
      dVar2 = *(double *)(p_Var8 + 3);
      p_Var7 = p_Var8[3]._M_parent;
      dVar3 = local_58->PITCH_FLARE;
      p_Var9 = p_Var8->_M_parent;
      local_50->_lat = *(double *)p_Var8;
      local_50->_lon = (double)p_Var9;
      local_50->_alt = dVar2;
      local_50->_ts = local_88;
      local_50->_head = (double)p_Var7;
      local_50->_pitch = dVar3;
      local_50->_roll = 0.0;
      local_50->mergeCount = 1;
      local_50->edgeIdx = 0xffffffffffffffff;
      local_50->f = (posFlagsTy)((ushort)*(undefined4 *)&local_50->f & 0x8000 | 13000);
      paVar1 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)local_80,
                 (long)&local_80->_M_parent->_M_color + *(long *)local_80);
      std::__cxx11::string::operator=((string *)_rwyId,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back((char)_rwyId);
      std::__cxx11::string::_M_append((char *)_rwyId,(ulong)*(double *)(p_Var8 + 2));
      if ((_logTxt->_M_string_length != 0) && ((int)dataRefs.iLogLevel < 1)) {
        pcVar5 = (_rwyId->_M_dataplus)._M_p;
        positionTy::operator_cast_to_string(&local_78,__return_storage_ptr__);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0xa92,"LTAptFindRwy",logDEBUG,"Found runway %s at %s for %s",pcVar5,
               local_78._M_dataplus._M_p,(_logTxt->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0015c091;
    }
  }
  if ((_logTxt->_M_string_length != 0) && ((int)dataRefs.iLogLevel < 1)) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0xa79,"LTAptFindRwy",logDEBUG,"Didn\'t find runway for %s with heading %.0f",_from->_head
           ,(_logTxt->_M_dataplus)._M_p);
  }
  _rwyId->_M_string_length = 0;
  *(_rwyId->_M_dataplus)._M_p = '\0';
  __return_storage_ptr__->_lat = NAN;
  __return_storage_ptr__->_lon = NAN;
  __return_storage_ptr__->_alt = NAN;
  __return_storage_ptr__->_ts = NAN;
  __return_storage_ptr__->_head = NAN;
  __return_storage_ptr__->_pitch = NAN;
  __return_storage_ptr__->_roll = NAN;
  __return_storage_ptr__->mergeCount = 1;
  __return_storage_ptr__->f = (posFlagsTy)((ushort)__return_storage_ptr__->f & 0x8000);
  __return_storage_ptr__->edgeIdx = 0xffffffffffffffff;
LAB_0015c091:
  pthread_mutex_unlock((pthread_mutex_t *)&mtxGMapApt);
  return __return_storage_ptr__;
}

Assistant:

positionTy LTAptFindRwy (const LTAircraft::FlightModel& _mdl,
                         const positionTy& _from,
                         double _speed_m_s,
                         std::string& _rwyId,
                         const std::string& _logTxt)
{
    // --- Preparation of aircraft-related data ---
    // allowed VSI range depends on aircraft model, converted to m/s
    const double vsi_min = -_mdl.VSI_MAX * Ms_per_FTm;
    const double vsi_max =  _mdl.VSI_FINAL * ART_RWY_MAX_VSI_F * Ms_per_FTm;
    
    // The speed to use: cut off at a reasonable approach speed:
    if (_speed_m_s > _mdl.FLAPS_DOWN_SPEED * ART_APPR_SPEED_F / KT_per_M_per_S)
        _speed_m_s = _mdl.FLAPS_DOWN_SPEED * ART_APPR_SPEED_F / KT_per_M_per_S;
    
    // --- Variables holding Best Match ---
    const Apt* bestApt = nullptr;               // best matching apt
    const RwyEndPt* bestRwyEndPt = nullptr;     // best matching runway endpoint
    // The heading diff of the best match to its runway
    // (initialized to the max allowed value so that worse heading diffs aren't considered)
    double bestHeadingDiff = ART_RWY_MAX_HEAD_DIFF;
    // when would we arrive there?
    double bestArrivalTS = NAN;
    
    // --- Iterate the airports ---
    // Access to the list of airports is guarded by a lock
    std::lock_guard<std::mutex> lock(mtxGMapApt);

    // loop over airports
    for (mapAptTy::const_iterator iterApt = gmapApt.cbegin();
         iterApt != gmapApt.cend();
         ++iterApt)
    {
        const Apt& apt = iterApt->second;
        
        // Find the rwy endpoints matching the current plane's heading
        for (const RwyEndPt& re: apt.GetRwyEndPtVec())
        {
            // skip if rwy heading differs too much from flight heading
            if (std::abs(HeadingDiff(re.heading, _from.heading())) > ART_RWY_MAX_HEAD_DIFF)
                continue;
            
            // We need to know the runway's altitude for what comes next
            if (std::isnan(re.alt_m))
                continue;
            
            // Heading towards rwy, compared to current flight's heading
            // (Find the rwy which requires least turn now.)
            const double bearing = CoordAngle(_from.lat(), _from.lon(), re.lat, re.lon);
            const double headingDiff = std::abs(HeadingDiff(_from.heading(), bearing));
            if (headingDiff > bestHeadingDiff)      // worse than best known match?
                continue;
            
            // 3. Vertical speed, for which we need to know distance / flying time
            const double dist = CoordDistance(_from.lat(), _from.lon(), re.lat, re.lon);
            if (dist > ART_RWY_MAX_DIST)        // too far out
                continue;
            const double d_ts = dist / _speed_m_s;
            const double agl = _from.alt_m() - re.alt_m;
            const double vsi = (-agl) / d_ts;
            if (vsi < vsi_min)                  // would need too steep sinking?
                continue;
            
            // flying more than 300ft/100m above ground?
            if (agl > 100.0) {
                // also consider max_vsi
                if (vsi > vsi_max)              // would fly too flat? -> too far out?
                    continue;
            } else {
                // pretty close too the ground, cut off at shorter distance
                if (dist > 3000.0)              // 3000m is a runway length...we shouldn't look further that close to the ground
                    continue;
            }
            
            // We've got a match!
            bestApt = &apt;
            bestRwyEndPt = &re;
            bestHeadingDiff = headingDiff;      // the heading diff (which would be a selection criterion on several rwys match)
            bestArrivalTS = _from.ts() + d_ts;   // the arrival timestamp
        }
    }
    
    // Didn't find a suitable runway?
    if (!bestRwyEndPt || !bestApt) {
        if (!_logTxt.empty())
            LOG_MSG(logDEBUG, "Didn't find runway for %s with heading %.0f",
                    _logTxt.c_str(),
                    _from.heading());
        _rwyId.clear();
        return positionTy();
    }
    
    // Found a match!
    positionTy retPos = positionTy(bestRwyEndPt->lat,
                                   bestRwyEndPt->lon,
                                   bestRwyEndPt->alt_m,
                                   bestArrivalTS,
                                   bestRwyEndPt->heading,
                                   _mdl.PITCH_FLARE,
                                   0.0,
                                   GND_ON,
                                   UNIT_WORLD, UNIT_DEG,
                                   FPH_TOUCH_DOWN);
    retPos.f.bHeadFixed = true;
    retPos.f.specialPos = SPOS_RWY;
    _rwyId = bestApt->GetId();
    _rwyId += '/';
    _rwyId += bestRwyEndPt->id;
    if (!_logTxt.empty())
        LOG_MSG(logDEBUG, "Found runway %s at %s for %s",
                _rwyId.c_str(),
                std::string(retPos).c_str(),
                _logTxt.c_str());
    return retPos;
}